

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webp_dec.c
# Opt level: O0

uint8_t * WebPDecodeYUV(uint8_t *data,size_t data_size,int *width,int *height,uint8_t **u,
                       uint8_t **v,int *stride,int *uv_stride)

{
  uint8_t *puVar1;
  undefined8 *in_R8;
  undefined8 *in_R9;
  WebPYUVABuffer *buf;
  uint8_t *out;
  WebPDecBuffer output;
  undefined8 local_90;
  undefined8 local_88;
  undefined4 local_78;
  undefined4 local_74;
  
  puVar1 = Decode(output.u.YUVA.u_size._4_4_,(uint8_t *)output.u.YUVA.y_size,output.u._40_8_,
                  (int *)output.u._32_8_,(int *)output.u.YUVA.a,(WebPDecBuffer *)output.u.YUVA.v);
  if (puVar1 != (uint8_t *)0x0) {
    *in_R8 = local_90;
    *in_R9 = local_88;
    *(undefined4 *)out = local_78;
    *(undefined4 *)output._0_8_ = local_74;
  }
  return puVar1;
}

Assistant:

uint8_t* WebPDecodeYUV(const uint8_t* data, size_t data_size,
                       int* width, int* height, uint8_t** u, uint8_t** v,
                       int* stride, int* uv_stride) {
  WebPDecBuffer output;   // only to preserve the side-infos
  uint8_t* const out = Decode(MODE_YUV, data, data_size,
                              width, height, &output);

  if (out != NULL) {
    const WebPYUVABuffer* const buf = &output.u.YUVA;
    *u = buf->u;
    *v = buf->v;
    *stride = buf->y_stride;
    *uv_stride = buf->u_stride;
    assert(buf->u_stride == buf->v_stride);
  }
  return out;
}